

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void show_resolve_info(Curl_easy *data,Curl_dns_entry *dns)

{
  uint __af;
  curl_trc_feat *pcVar1;
  _Bool _Var2;
  CURLcode CVar3;
  size_t sVar4;
  Curl_addrinfo *pCVar5;
  long lVar6;
  dynbuf *s;
  char *pcVar7;
  dynbuf out [2];
  char buf [46];
  dynbuf adStack_a8 [2];
  char local_68 [56];
  
  if (((data->set).field_0x8cd & 0x10) == 0) {
    return;
  }
  if (dns->hostname[0] == '\0') {
    return;
  }
  pcVar7 = dns->hostname;
  _Var2 = Curl_host_is_ipnum(pcVar7);
  if (_Var2) {
    return;
  }
  pCVar5 = dns->addr;
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)))) {
    if (dns->hostname[0] == '\0') {
      pcVar7 = "(none)";
    }
    Curl_infof(data,"Host %s:%d was resolved.",pcVar7,(ulong)(uint)dns->hostport);
  }
  Curl_dyn_init(adStack_a8,0x400);
  Curl_dyn_init(adStack_a8 + 1,0x400);
  if (pCVar5 != (Curl_addrinfo *)0x0) {
    do {
      __af = pCVar5->ai_family;
      if ((__af | 8) == 10) {
        local_68[0] = '\0';
        if (__af == 2) {
          lVar6 = 4;
LAB_00130616:
          inet_ntop(__af,pCVar5->ai_addr->sa_data + lVar6 + -2,local_68,0x2e);
        }
        else if (__af == 10) {
          lVar6 = 8;
          goto LAB_00130616;
        }
        s = adStack_a8 + (__af != 2);
        sVar4 = Curl_dyn_len(s);
        if (((sVar4 != 0) && (CVar3 = Curl_dyn_addn(s,", ",2), CVar3 != CURLE_OK)) ||
           (CVar3 = Curl_dyn_add(s,local_68), CVar3 != CURLE_OK)) {
          if ((((data->set).field_0x8cd & 0x10) != 0) &&
             ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
              (0 < pcVar1->log_level)))) {
            Curl_infof(data,"too many IP, cannot show");
          }
          goto LAB_00130744;
        }
      }
      pCVar5 = pCVar5->ai_next;
    } while (pCVar5 != (Curl_addrinfo *)0x0);
  }
  if (((data->set).field_0x8cd & 0x10) != 0) {
    pcVar1 = (data->state).feat;
    if ((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) {
      sVar4 = Curl_dyn_len(adStack_a8 + 1);
      if (sVar4 == 0) {
        pcVar7 = "(none)";
      }
      else {
        pcVar7 = Curl_dyn_ptr(adStack_a8 + 1);
      }
      Curl_infof(data,"IPv6: %s",pcVar7);
      if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_00130744;
    }
    pcVar1 = (data->state).feat;
    if ((pcVar1 == (curl_trc_feat *)0x0) || (0 < pcVar1->log_level)) {
      sVar4 = Curl_dyn_len(adStack_a8);
      if (sVar4 == 0) {
        pcVar7 = "(none)";
      }
      else {
        pcVar7 = Curl_dyn_ptr(adStack_a8);
      }
      Curl_infof(data,"IPv4: %s",pcVar7);
    }
  }
LAB_00130744:
  Curl_dyn_free(adStack_a8);
  Curl_dyn_free(adStack_a8 + 1);
  return;
}

Assistant:

static void show_resolve_info(struct Curl_easy *data,
                              struct Curl_dns_entry *dns)
{
  struct Curl_addrinfo *a;
  CURLcode result = CURLE_OK;
#ifdef CURLRES_IPV6
  struct dynbuf out[2];
#else
  struct dynbuf out[1];
#endif
  DEBUGASSERT(data);
  DEBUGASSERT(dns);

  if(!data->set.verbose ||
     /* ignore no name or numerical IP addresses */
     !dns->hostname[0] || Curl_host_is_ipnum(dns->hostname))
    return;

  a = dns->addr;

  infof(data, "Host %s:%d was resolved.",
        (dns->hostname[0] ? dns->hostname : "(none)"), dns->hostport);

  Curl_dyn_init(&out[0], 1024);
#ifdef CURLRES_IPV6
  Curl_dyn_init(&out[1], 1024);
#endif

  while(a) {
    if(
#ifdef CURLRES_IPV6
       a->ai_family == PF_INET6 ||
#endif
       a->ai_family == PF_INET) {
      char buf[MAX_IPADR_LEN];
      struct dynbuf *d = &out[(a->ai_family != PF_INET)];
      Curl_printable_address(a, buf, sizeof(buf));
      if(Curl_dyn_len(d))
        result = Curl_dyn_addn(d, ", ", 2);
      if(!result)
        result = Curl_dyn_add(d, buf);
      if(result) {
        infof(data, "too many IP, cannot show");
        goto fail;
      }
    }
    a = a->ai_next;
  }

#ifdef CURLRES_IPV6
  infof(data, "IPv6: %s",
        (Curl_dyn_len(&out[1]) ? Curl_dyn_ptr(&out[1]) : "(none)"));
#endif
  infof(data, "IPv4: %s",
        (Curl_dyn_len(&out[0]) ? Curl_dyn_ptr(&out[0]) : "(none)"));

fail:
  Curl_dyn_free(&out[0]);
#ifdef CURLRES_IPV6
  Curl_dyn_free(&out[1]);
#endif
}